

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O1

void __thiscall glTF2::Buffer::SEncodedRegion::~SEncodedRegion(SEncodedRegion *this)

{
  if (*(void **)(this + 0x10) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x10));
  }
  if (*(SEncodedRegion **)(this + 0x20) != this + 0x30) {
    operator_delete(*(SEncodedRegion **)(this + 0x20),*(long *)(this + 0x30) + 1);
    return;
  }
  return;
}

Assistant:

~SEncodedRegion() { delete[] DecodedData; }